

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubsumptionDemodulationHelper.cpp
# Opt level: O0

ostream * Inferences::operator<<(ostream *o,OverlayBinder *binder)

{
  bool bVar1;
  reference pvVar2;
  ostream *poVar3;
  long in_RSI;
  ostream *in_RDI;
  value_type binding_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  BindingsMap *__range1_1;
  value_type binding;
  const_iterator __end1;
  const_iterator __begin1;
  BindingsMap *__range1;
  bool first;
  ostream *in_stack_fffffffffffffe98;
  TermList *in_stack_fffffffffffffea0;
  TermList *this;
  undefined1 *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  string local_108 [32];
  TermList local_e8;
  string local_e0 [32];
  undefined8 local_c0;
  uint64_t local_b8;
  _Node_iterator_base<std::pair<const_unsigned_int,_Kernel::TermList>,_false> local_b0;
  _Node_iterator_base<std::pair<const_unsigned_int,_Kernel::TermList>,_false> local_a8;
  long local_a0;
  string local_98 [48];
  undefined1 local_68 [8];
  string local_60 [32];
  undefined8 local_40;
  uint64_t local_38;
  _Node_iterator_base<std::pair<const_unsigned_int,_Kernel::TermList>,_false> local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_Kernel::TermList>,_false> local_28;
  long local_20;
  byte local_11;
  long local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator<<(in_RDI,"OverlayBinder { ");
  local_11 = 1;
  local_20 = local_10;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_Kernel::TermList,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>_>
       ::begin((unordered_map<unsigned_int,_Kernel::TermList,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>_>
                *)in_stack_fffffffffffffe98);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_Kernel::TermList,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>_>
       ::end((unordered_map<unsigned_int,_Kernel::TermList,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>_>
              *)in_stack_fffffffffffffe98);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_Kernel::TermList>,_false,_false>::
             operator*((_Node_const_iterator<std::pair<const_unsigned_int,_Kernel::TermList>,_false,_false>
                        *)0x82f5b8);
    local_40 = *(undefined8 *)pvVar2;
    local_38 = (pvVar2->second)._content;
    if ((local_11 & 1) == 0) {
      std::operator<<(local_8,", ");
    }
    else {
      local_11 = 0;
    }
    poVar3 = local_8;
    in_stack_fffffffffffffed0 = local_68;
    in_stack_fffffffffffffedc = 0;
    Kernel::TermList::TermList
              (in_stack_fffffffffffffea0,(uint)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffe98 >> 0x18,0));
    Kernel::TermList::toString_abi_cxx11_
              ((TermList *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               SUB81((ulong)in_stack_fffffffffffffed0 >> 0x38,0));
    poVar3 = std::operator<<(poVar3,local_60);
    poVar3 = std::operator<<(poVar3," -> ");
    Kernel::TermList::toString_abi_cxx11_
              ((TermList *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               SUB81((ulong)in_stack_fffffffffffffed0 >> 0x38,0));
    std::operator<<(poVar3,local_98);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_60);
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_Kernel::TermList>,_false,_false>::operator++
              ((_Node_const_iterator<std::pair<const_unsigned_int,_Kernel::TermList>,_false,_false>
                *)in_stack_fffffffffffffea0);
  }
  std::operator<<(local_8," / ");
  local_11 = 1;
  local_a0 = local_10 + 0x38;
  local_a8._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_Kernel::TermList,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>_>
       ::begin((unordered_map<unsigned_int,_Kernel::TermList,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>_>
                *)in_stack_fffffffffffffe98);
  local_b0._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_Kernel::TermList,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>_>
       ::end((unordered_map<unsigned_int,_Kernel::TermList,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Kernel::TermList>_>_>
              *)in_stack_fffffffffffffe98);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_a8,&local_b0);
    if (!bVar1) break;
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_Kernel::TermList>,_false,_false>::
             operator*((_Node_const_iterator<std::pair<const_unsigned_int,_Kernel::TermList>,_false,_false>
                        *)0x82f793);
    local_c0 = *(undefined8 *)pvVar2;
    local_b8 = (pvVar2->second)._content;
    if ((local_11 & 1) == 0) {
      std::operator<<(local_8,", ");
    }
    else {
      local_11 = 0;
    }
    poVar3 = local_8;
    this = &local_e8;
    Kernel::TermList::TermList
              (this,(uint)((ulong)in_stack_fffffffffffffe98 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffe98 >> 0x18,0));
    Kernel::TermList::toString_abi_cxx11_
              ((TermList *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               SUB81((ulong)in_stack_fffffffffffffed0 >> 0x38,0));
    poVar3 = std::operator<<(poVar3,local_e0);
    in_stack_fffffffffffffe98 = std::operator<<(poVar3," -> ");
    Kernel::TermList::toString_abi_cxx11_
              ((TermList *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               SUB81((ulong)in_stack_fffffffffffffed0 >> 0x38,0));
    std::operator<<(in_stack_fffffffffffffe98,local_108);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_e0);
    std::__detail::
    _Node_const_iterator<std::pair<const_unsigned_int,_Kernel::TermList>,_false,_false>::operator++
              ((_Node_const_iterator<std::pair<const_unsigned_int,_Kernel::TermList>,_false,_false>
                *)this);
  }
  std::operator<<(local_8," }");
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& o, OverlayBinder const& binder)
{
  o << "OverlayBinder { ";
  bool first = true;
  for (auto binding : binder.m_base) {
    if (!first) {
      o << ", ";
    } else {
      first = false;
    }
    o << TermList(binding.first, false).toString() << " -> " << binding.second.toString();
  }
  o << " / ";
  first = true;
  for (auto binding : binder.m_overlay) {
    if (!first) {
      o << ", ";
    } else {
      first = false;
    }
    o << TermList(binding.first, false).toString() << " -> " << binding.second.toString();
  }
  o << " }";
  return o;
}